

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MockComparatorCopierTest.cpp
# Opt level: O0

void __thiscall
TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_Test::
TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_Test
          (TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_Test *this)

{
  TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_Test *this_local;
  
  memset(this,0,8);
  TEST_GROUP_CppUTestGroupMockComparatorCopierTest::TEST_GROUP_CppUTestGroupMockComparatorCopierTest
            (&this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest);
  (this->super_TEST_GROUP_CppUTestGroupMockComparatorCopierTest).super_Utest._vptr_Utest =
       (_func_int **)
       &
       PTR__TEST_MockComparatorCopierTest_customTypeOutputParameterWithIgnoredParameters_Test_00331c60
  ;
  return;
}

Assistant:

TEST(MockComparatorCopierTest, customTypeOutputParameterWithIgnoredParameters)
{
    MyTypeForTesting expectedObject(444537909);
    MyTypeForTesting actualObject(98765);
    MyTypeForTestingCopier copier;
    mock().installCopier("MyTypeForTesting", copier);

    mock().expectOneCall("foo").withOutputParameterOfTypeReturning("MyTypeForTesting", "bar", &expectedObject).ignoreOtherParameters();
    mock().actualCall("foo").withOutputParameterOfType("MyTypeForTesting", "bar", &actualObject).withParameter("other", 1);

    mock().checkExpectations();
    CHECK_EQUAL(444537909, *(expectedObject.value));
    CHECK_EQUAL(444537909, *(actualObject.value));

    mock().removeAllComparatorsAndCopiers();
}